

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakHash.c
# Opt level: O0

HashReturn
Keccak_HashInitialize
          (Keccak_HashInstance *instance,uint rate,uint capacity,uint hashbitlen,
          uchar delimitedSuffix)

{
  undefined4 in_ECX;
  long in_RDI;
  char in_R8B;
  HashReturn result;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 local_4;
  
  if (in_R8B == '\0') {
    local_4 = KECCAK_FAIL;
  }
  else {
    local_4 = KeccakWidth1600_SpongeInitialize
                        ((KeccakWidth1600_SpongeInstance *)
                         CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0,0x101c52);
    if (local_4 == KECCAK_SUCCESS) {
      *(undefined4 *)(in_RDI + 0xd4) = in_ECX;
      *(char *)(in_RDI + 0xd8) = in_R8B;
      local_4 = KECCAK_SUCCESS;
    }
  }
  return local_4;
}

Assistant:

HashReturn Keccak_HashInitialize(Keccak_HashInstance *instance, unsigned int rate, unsigned int capacity, unsigned int hashbitlen, unsigned char delimitedSuffix)
{
    HashReturn result;

    if (delimitedSuffix == 0)
        return KECCAK_FAIL;
    result = (HashReturn)KeccakWidth1600_SpongeInitialize(&instance->sponge, rate, capacity);
    if (result != KECCAK_SUCCESS)
        return result;
    instance->fixedOutputLength = hashbitlen;
    instance->delimitedSuffix = delimitedSuffix;
    return KECCAK_SUCCESS;
}